

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall ghc::filesystem::path::compare(path *this,string_type *s)

{
  int iVar1;
  path local_38;
  string_type *local_18;
  string_type *s_local;
  path *this_local;
  
  local_18 = s;
  s_local = &this->_path;
  path<std::__cxx11::string,ghc::filesystem::path>(&local_38,s,auto_format);
  iVar1 = compare(this,&local_38);
  ~path(&local_38);
  return iVar1;
}

Assistant:

GHC_INLINE int path::compare(const string_type& s) const
{
    return compare(path(s));
}